

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::LoadSuperConstructorObject(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Symbol *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  OpCode op;
  
  pSVar1 = funcInfo->superConstructorSymbol;
  if (pSVar1 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8cc,"(superConstructorSym)","superConstructorSym");
    if (!bVar3) goto LAB_00802971;
    *puVar5 = 0;
  }
  BVar4 = FuncInfo::IsLambda(funcInfo);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8cd,"(!funcInfo->IsLambda())","!funcInfo->IsLambda()");
    if (!bVar3) {
LAB_00802971:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  BVar4 = FuncInfo::IsDerivedClassConstructor(funcInfo);
  op = LdFuncObj;
  if (BVar4 == 0) {
    op = LdUndef;
  }
  Js::ByteCodeWriter::Reg1(&this->m_writer,op,pSVar1->location);
  return;
}

Assistant:

void ByteCodeGenerator::LoadSuperConstructorObject(FuncInfo *funcInfo)
{
    Symbol* superConstructorSym = funcInfo->GetSuperConstructorSymbol();
    Assert(superConstructorSym);
    Assert(!funcInfo->IsLambda());

    if (funcInfo->IsDerivedClassConstructor())
    {
        m_writer.Reg1(Js::OpCode::LdFuncObj, superConstructorSym->GetLocation());
    }
    else
    {
        m_writer.Reg1(Js::OpCode::LdUndef, superConstructorSym->GetLocation());
    }
}